

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcap.c
# Opt level: O0

Capture * findopen(Capture *cap)

{
  Capture *pCVar1;
  Capture *pCVar2;
  bool bVar3;
  int local_14;
  Capture *pCStack_10;
  int n;
  Capture *cap_local;
  
  local_14 = 0;
  pCStack_10 = cap;
  do {
    while (pCVar2 = pCStack_10 + -1, pCStack_10[-1].kind == '\0') {
      local_14 = local_14 + 1;
      pCStack_10 = pCVar2;
    }
    pCVar1 = pCStack_10 + -1;
    pCStack_10 = pCVar2;
  } while ((pCVar1->siz != '\0') || (bVar3 = local_14 != 0, local_14 = local_14 + -1, bVar3));
  return pCVar2;
}

Assistant:

static Capture *findopen (Capture *cap) {
  int n = 0;  /* number of closes waiting an open */
  for (;;) {
    cap--;
    if (isclosecap(cap)) n++;  /* one more open to skip */
    else if (!isfullcap(cap))
      if (n-- == 0) return cap;
  }
}